

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Abc_NodeInvUpdateObjFanoutPolarity(Abc_Obj_t *pObj,Abc_Obj_t *pFanout)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  char *__assertion;
  
  if (((*(uint *)&pFanout->field_0x14 & 0xf) == 7) && ((pFanout->vFanins).nSize == 1)) {
    Abc_NodeInvUpdateFanPolarity(pFanout);
    return;
  }
  iVar3 = Abc_NodeFindFanin(pFanout,pObj);
  pVVar2 = pFanout->pNtk->vPhases;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    __assertion = "p->pNtk->vPhases";
  }
  else {
    if ((-1 < iVar3) && (iVar3 < (pFanout->vFanins).nSize)) {
      iVar1 = pFanout->Id;
      if ((-1 < (long)iVar1) && (iVar1 < pVVar2->nSize)) {
        pVVar2->pArray[iVar1] = pVVar2->pArray[iVar1] ^ 1 << ((byte)iVar3 & 0x1f);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    __assertion = "i >= 0 && i < Abc_ObjFaninNum(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                ,0x18b,"void Abc_ObjFaninFlipPhase(Abc_Obj_t *, int)");
}

Assistant:

void Abc_NodeInvUpdateObjFanoutPolarity( Abc_Obj_t * pObj, Abc_Obj_t * pFanout )
{
    if ( Abc_SclObjIsBufInv(pFanout) )
        Abc_NodeInvUpdateFanPolarity( pFanout );
    else
        Abc_ObjFaninFlipPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) );
}